

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcs.cc
# Opt level: O2

int __thiscall dcs::FileHeader::readFrom(FileHeader *this,char *buf,size_t len)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint32_t uVar2;
  runtime_error *prVar3;
  int *in_R9;
  char local_54 [4];
  string local_50;
  
  if (len < 0x20) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_54[0] = '\x10';
    local_54[1] = '\0';
    local_54[2] = '\0';
    local_54[3] = '\0';
    util::str<char[42],char[85],char[2],int>
              (&local_50,(util *)"Assertion `(len - nread) >= n` failed at ",
               (char (*) [42])
               "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/dcs/dcs.cc"
               ,(char (*) [85])":",(char (*) [2])local_54,in_R9);
    std::runtime_error::runtime_error(prVar3,(string *)&local_50);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,buf,buf + 0x20);
  std::__cxx11::string::operator=((string *)this,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if ((len & 0xfffffffffffffff8) == 0x20) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_54[0] = '\x18';
    local_54[1] = '\0';
    local_54[2] = '\0';
    local_54[3] = '\0';
    util::str<char[42],char[85],char[2],int>
              (&local_50,(util *)"Assertion `(len - nread) >= n` failed at ",
               (char (*) [42])
               "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/dcs/dcs.cc"
               ,(char (*) [85])":",(char (*) [2])local_54,in_R9);
    std::runtime_error::runtime_error(prVar3,(string *)&local_50);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,buf + 0x20,buf + 0x28);
  uVar2 = std::__cxx11::stoi(&local_50,(size_t *)0x0,10);
  this->length = uVar2;
  std::__cxx11::string::~string((string *)&local_50);
  if (0xffffffffffffffeb < len - 0x3c) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_54[0] = ' ';
    local_54[1] = '\0';
    local_54[2] = '\0';
    local_54[3] = '\0';
    util::str<char[42],char[85],char[2],int>
              (&local_50,(util *)"Assertion `(len - nread) >= n` failed at ",
               (char (*) [42])
               "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/dcs/dcs.cc"
               ,(char (*) [85])":",(char (*) [2])local_54,in_R9);
    std::runtime_error::runtime_error(prVar3,(string *)&local_50);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,buf + 0x28,buf + 0x3c);
  std::__cxx11::string::operator=((string *)&this->misc1,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (len - 0x44 < 0xfffffffffffffff8) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->misc2,8);
    *(undefined8 *)
     (this->misc2).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
     super__Vector_impl_data._M_start = *(undefined8 *)(buf + 0x3c);
    return 0x44;
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_54[0] = '(';
  local_54[1] = '\0';
  local_54[2] = '\0';
  local_54[3] = '\0';
  util::str<char[42],char[85],char[2],int>
            (&local_50,(util *)"Assertion `(len - nread) >= n` failed at ",
             (char (*) [42])
             "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/dcs/dcs.cc",
             (char (*) [85])":",(char (*) [2])local_54,in_R9);
  std::runtime_error::runtime_error(prVar3,(string *)&local_50);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int FileHeader::readFrom(const char* buf, size_t len) {
  size_t nread = 0;

  // 32 bytes hold the DCS file name (and trailing spaces)
  {
    constexpr unsigned n = 32;
    ASSERT((len - nread) >= n);
    name = std::string(buf + nread, n);
    nread += n;
  }

  // 8 bytes holding length of payload
  {
    constexpr unsigned n = 8;
    ASSERT((len - nread) >= n);
    length = std::stoi(std::string(buf + nread, n));
    nread += n;
  }

  // 20 bytes holding some ASCII data
  {
    constexpr unsigned n = 20;
    ASSERT((len - nread) >= n);
    misc1 = std::string(buf + nread, n);
    nread += n;
  }

  // 8 bytes holding some binary data
  {
    constexpr unsigned n = 8;
    ASSERT((len - nread) >= n);
    misc2.resize(n);
    memcpy(misc2.data(), &buf[nread], n);
    nread += n;
  }

  return nread;
}